

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

int32 vector_normalize(vector_t v,uint32 dim)

{
  int32 local_24;
  double dStack_20;
  int ret_val;
  float64 s;
  uint32 i;
  uint32 dim_local;
  vector_t v_local;
  
  local_24 = 0;
  dStack_20 = 0.0;
  for (s._0_4_ = 0; s._0_4_ < dim; s._0_4_ = s._0_4_ + 1) {
    dStack_20 = (double)(float)v[s._0_4_] + dStack_20;
  }
  if ((dStack_20 != 0.0) || (NAN(dStack_20))) {
    for (s._0_4_ = 0; s._0_4_ < dim; s._0_4_ = s._0_4_ + 1) {
      v[s._0_4_] = (float32)((float)v[s._0_4_] / (float)dStack_20);
    }
  }
  else {
    local_24 = -2;
  }
  return local_24;
}

Assistant:

int
vector_normalize(vector_t v, uint32 dim)
{
    uint32 i;
    float64 s;
    int ret_val = S3_SUCCESS;

    for (i = 0, s = 0; i < dim; i++)
        s += v[i];

    if (s != 0) {
        for (i = 0; i < dim; i++)
            v[i] /= (float) s;
    }
    else {
        ret_val = S3_WARNING;
    }

    return ret_val;
}